

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int *piVar2;
  Allocator *pAVar3;
  void *pvVar4;
  float *pfVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  long lVar14;
  pointer piVar15;
  int iVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  pointer piVar23;
  int iVar24;
  long lVar25;
  pointer piVar26;
  ulong uVar27;
  int iVar28;
  pointer piVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  int size_1;
  int iVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  void *pvVar37;
  size_type __n;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  int iVar41;
  float fVar42;
  int iVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int size_3;
  allocator_type local_1b9;
  Mat local_1b8;
  ulong local_170;
  pointer local_168;
  Mat *local_160;
  long local_158;
  uint local_14c;
  int remain_1;
  pointer local_140;
  ulong local_138;
  ulong local_130;
  pointer local_128;
  int remain;
  ulong local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  void *local_f8;
  ulong local_f0;
  ulong local_e8;
  pointer local_e0;
  vector<int,_std::allocator<int>_> _space_ofs;
  pointer local_b0;
  pointer local_a8;
  
  iVar41 = bottom_blob->c;
  if (iVar41 % this->group != 0) {
    return -100;
  }
  iVar16 = this->num_output;
  if (iVar16 % this->group != 0) {
    return -100;
  }
  local_158 = (long)bottom_blob->w;
  local_110 = (ulong)(uint)bottom_blob->h;
  iVar19 = (this->kernel_h + -1) * this->dilation_h;
  uVar32 = bottom_blob->elemsize;
  iVar33 = (this->kernel_w + -1) * this->dilation_w + (bottom_blob->w + -1) * this->stride_w + 1;
  iVar31 = iVar19 + (bottom_blob->h - 1U) * this->stride_h + 1;
  local_1b8.elemsize = 0;
  local_1b8.packing = 0;
  local_1b8.data = (pointer)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.c = 0;
  local_1b8.cstep = 0;
  local_160 = bottom_blob;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    if (&local_1b8 != top_blob) {
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_1b8.data = top_blob->data;
      local_1b8.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_1b8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_1b8.elemsize = top_blob->elemsize;
      local_1b8.packing = top_blob->packing;
      local_1b8.allocator = top_blob->allocator;
      uVar10 = top_blob->dims;
      uVar11 = top_blob->w;
      uVar12 = top_blob->h;
      uVar13 = top_blob->c;
      local_1b8.cstep = top_blob->cstep;
      local_1b8.dims = uVar10;
      local_1b8.w = uVar11;
      local_1b8.h = uVar12;
      local_1b8.c = uVar13;
    }
    iVar16 = this->num_output;
    pAVar3 = opt->blob_allocator;
    auVar46._0_4_ = -(uint)(local_1b8.dims == 3);
    auVar46._4_4_ = -(uint)(iVar33 == local_1b8.w);
    auVar46._8_4_ = -(uint)(iVar31 == local_1b8.h);
    auVar46._12_4_ = -(uint)(iVar16 == local_1b8.c);
    iVar19 = movmskps(iVar19,auVar46);
    if ((((iVar19 != 0xf) || (local_1b8.packing != 1)) || (local_1b8.allocator != pAVar3)) ||
       (local_1b8.elemsize != uVar32)) {
      piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if ((pointer)local_1b8.data != (pointer)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1b8.data = (pointer)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.refcount = (int *)0x0;
      local_1b8.packing = 1;
      local_1b8.dims = 3;
      local_1b8.cstep = ((long)(iVar31 * iVar33) * uVar32 + 0xf & 0xfffffffffffffff0) / uVar32;
      local_1b8.elemsize = uVar32;
      local_1b8.allocator = pAVar3;
      local_1b8.w = iVar33;
      local_1b8.h = iVar31;
      local_1b8.c = iVar16;
      if ((long)iVar16 * local_1b8.cstep != 0) {
        uVar38 = (long)iVar16 * local_1b8.cstep * uVar32 + 3 & 0xfffffffffffffffc;
        if (pAVar3 == (Allocator *)0x0) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          iVar16 = posix_memalign((void **)&_space_ofs,0x10,uVar38 + 4);
          local_1b8.data =
               _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          if (iVar16 != 0) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)0x0;
            local_1b8.data =
                 _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
        else {
          iVar16 = (*pAVar3->_vptr_Allocator[2])(pAVar3,uVar38 + 4);
          local_1b8.data = (pointer)CONCAT44(extraout_var_00,iVar16);
        }
        local_1b8.refcount = (int *)((long)local_1b8.data + uVar38);
        *(undefined4 *)((long)local_1b8.data + uVar38) = 1;
      }
    }
    iVar16 = -100;
    if ((pointer)local_1b8.data == (pointer)0x0) goto LAB_0015a5be;
    lVar17 = (long)local_1b8.c * local_1b8.cstep;
  }
  else {
    local_1b8.allocator = opt->workspace_allocator;
    auVar50._4_4_ = -(uint)(iVar31 == 0);
    auVar50._0_4_ = -(uint)(iVar33 == 0);
    auVar50._8_4_ = -(uint)(iVar16 == 0);
    auVar50._12_4_ = 0;
    movmskps(iVar19,auVar50 << 0x20);
    local_1b8.data = (pointer)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.refcount = (int *)0x0;
    local_1b8.packing = 1;
    local_1b8.dims = 3;
    local_1b8.cstep = ((long)(iVar31 * iVar33) * uVar32 + 0xf & 0xfffffffffffffff0) / uVar32;
    local_1b8.elemsize = uVar32;
    local_1b8.w = iVar33;
    local_1b8.h = iVar31;
    local_1b8.c = iVar16;
    if ((long)iVar16 * local_1b8.cstep != 0) {
      uVar38 = (long)iVar16 * local_1b8.cstep * uVar32 + 3 & 0xfffffffffffffffc;
      if (local_1b8.allocator == (Allocator *)0x0) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        iVar16 = posix_memalign((void **)&_space_ofs,0x10,uVar38 + 4);
        local_1b8.data =
             _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (iVar16 != 0) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_1b8.data =
               _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
      else {
        iVar16 = (*(local_1b8.allocator)->_vptr_Allocator[2])(local_1b8.allocator,uVar38 + 4);
        local_1b8.data = (pointer)CONCAT44(extraout_var,iVar16);
      }
      local_1b8.refcount = (int *)((long)local_1b8.data + uVar38);
      *(undefined4 *)((long)local_1b8.data + uVar38) = 1;
    }
    iVar16 = -100;
    if ((pointer)local_1b8.data == (pointer)0x0) goto LAB_0015a5be;
    lVar17 = (long)local_1b8.c * local_1b8.cstep;
  }
  iVar16 = -100;
  if (lVar17 == 0) goto LAB_0015a5be;
  uVar39 = this->kernel_w * this->kernel_h;
  __n = (size_type)(int)uVar39;
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,&local_1b9);
  piVar15 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
  iVar16 = local_1b8.w;
  sVar7 = local_1b8.elemsize;
  pvVar4 = local_1b8.data;
  if (0 < this->kernel_h) {
    iVar19 = this->dilation_h;
    iVar43 = this->dilation_w;
    iVar21 = this->kernel_w;
    iVar20 = 0;
    iVar24 = 0;
    iVar28 = 0;
    do {
      if (0 < this->kernel_w) {
        lVar17 = 0;
        do {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar20 + lVar17] = iVar24;
          iVar24 = iVar24 + this->dilation_w;
          lVar17 = lVar17 + 1;
        } while ((int)lVar17 < this->kernel_w);
        iVar20 = iVar20 + (int)lVar17;
      }
      iVar24 = iVar24 + (iVar19 * iVar33 - iVar43 * iVar21);
      iVar28 = iVar28 + 1;
    } while (iVar28 < this->kernel_h);
  }
  iVar19 = this->group;
  if (iVar19 == this->num_output && iVar41 == iVar19) {
    local_e8 = (ulong)this->group;
    if (0 < (long)local_e8) {
      pvVar4 = local_160->data;
      local_f0 = local_160->cstep * local_160->elemsize;
      pvVar37 = (this->weight_data).data;
      local_160 = (Mat *)(local_1b8.cstep * local_1b8.elemsize);
      local_138 = CONCAT44(local_138._4_4_,local_1b8.w);
      _remain = (pointer)(ulong)(uint)(local_1b8.h * local_1b8.w);
      local_128 = (pointer)CONCAT44(local_128._4_4_,this->bias_term);
      local_f8 = (this->bias_data).data;
      uVar34 = iVar31 * iVar33;
      uVar38 = (ulong)uVar34;
      _remain_1 = (float *)(this->activation_params).data;
      local_130 = (ulong)(local_1b8.h * local_1b8.w + 3U & 0xfffffffc);
      lVar17 = (long)_remain - 1;
      auVar48._8_4_ = (int)lVar17;
      auVar48._0_8_ = lVar17;
      auVar48._12_4_ = (int)((ulong)lVar17 >> 0x20);
      piVar29 = (pointer)((long)local_1b8.data + 0xc);
      auVar48 = auVar48 ^ _DAT_00163170;
      local_118 = (ulong)(this->activation_type - 1);
      uVar32 = 0;
      local_140 = (pointer)local_1b8.data;
      piVar26 = (pointer)local_1b8.data;
      auVar46 = _DAT_00163350;
      auVar49 = _DAT_00163360;
      auVar50 = _DAT_00163170;
      do {
        iVar41 = 0;
        if ((int)local_128 != 0) {
          iVar41 = *(int *)((long)local_f8 + uVar32 * 4);
        }
        if (0 < remain) {
          uVar18 = 0;
          do {
            auVar44._8_4_ = (int)uVar18;
            auVar44._0_8_ = uVar18;
            auVar44._12_4_ = (int)(uVar18 >> 0x20);
            auVar47 = (auVar44 | auVar49) ^ auVar50;
            iVar16 = auVar48._4_4_;
            if ((bool)(~(iVar16 < auVar47._4_4_ ||
                        auVar48._0_4_ < auVar47._0_4_ && auVar47._4_4_ == iVar16) & 1)) {
              piVar29[uVar18 - 3] = iVar41;
            }
            if (auVar47._12_4_ <= auVar48._12_4_ &&
                (auVar47._8_4_ <= auVar48._8_4_ || auVar47._12_4_ != auVar48._12_4_)) {
              piVar29[uVar18 - 2] = iVar41;
            }
            auVar47 = (auVar44 | auVar46) ^ auVar50;
            iVar19 = auVar47._4_4_;
            if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar47._0_4_ <= auVar48._0_4_)) {
              piVar29[uVar18 - 1] = iVar41;
              piVar29[uVar18] = iVar41;
            }
            uVar18 = uVar18 + 4;
          } while (local_130 != uVar18);
        }
        if (0 < (int)local_110) {
          iVar41 = this->stride_h;
          iVar16 = this->stride_w;
          uVar18 = 0;
          do {
            if (0 < (int)local_158) {
              lVar17 = 0;
              do {
                if (0 < (int)uVar39) {
                  lVar36 = lVar17 * iVar16 * 4 +
                           (long)(int)(iVar41 * (uint)local_138 * (int)uVar18) * sVar7 +
                           (long)local_160 * uVar32;
                  uVar27 = 0;
                  do {
                    lVar25 = (long)piVar15[uVar27];
                    *(float *)((long)local_140 + lVar25 * 4 + lVar36) =
                         *(float *)((long)pvVar37 + uVar27 * 4) *
                         *(float *)((long)pvVar4 +
                                   lVar17 * 4 + uVar18 * local_158 * 4 + local_f0 * uVar32) +
                         *(float *)((long)local_140 + lVar25 * 4 + lVar36);
                    uVar27 = uVar27 + 1;
                  } while (uVar39 != uVar27);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 != local_158);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_110);
        }
        local_170 = uVar32;
        local_168 = piVar26;
        local_e0 = piVar29;
        if ((uint)local_118 < 4) {
          switch((long)&switchD_00159d78::switchdataD_00163a9c +
                 (long)(int)(&switchD_00159d78::switchdataD_00163a9c)[local_118]) {
          case 0x159d7a:
            if (0 < (int)uVar34) {
              uVar32 = 0;
              do {
                fVar42 = (float)piVar26[uVar32];
                if (fVar42 <= 0.0) {
                  fVar42 = 0.0;
                }
                piVar26[uVar32] = (int)fVar42;
                uVar32 = uVar32 + 1;
              } while (uVar38 != uVar32);
            }
            break;
          case 0x159da4:
            if (0 < (int)uVar34) {
              fVar42 = *_remain_1;
              fVar1 = _remain_1[1];
              uVar32 = 0;
              do {
                if ((float)piVar26[uVar32] <= fVar42 && fVar42 != (float)piVar26[uVar32]) {
                  piVar26[uVar32] = (int)fVar42;
                }
                if (fVar1 < (float)piVar26[uVar32]) {
                  piVar26[uVar32] = (int)fVar1;
                }
                uVar32 = uVar32 + 1;
              } while (uVar38 != uVar32);
            }
            break;
          case 0x159de3:
            if (0 < (int)uVar34) {
              fVar42 = *_remain_1;
              uVar32 = 0;
              do {
                uVar35 = -(uint)(0.0 < (float)piVar26[uVar32]);
                piVar26[uVar32] =
                     (int)((float)(~uVar35 & (uint)fVar42 | uVar35 & 0x3f800000) *
                          (float)piVar26[uVar32]);
                uVar32 = uVar32 + 1;
              } while (uVar38 != uVar32);
            }
            break;
          case 0x159e2e:
            if (0 < (int)uVar34) {
              uVar32 = 0;
              do {
                fVar42 = expf((float)(local_168[uVar32] ^ auVar50._0_4_));
                auVar49 = _DAT_00163360;
                auVar46 = _DAT_00163350;
                auVar50 = _DAT_00163170;
                local_168[uVar32] = (int)(1.0 / (fVar42 + 1.0));
                uVar32 = uVar32 + 1;
              } while (uVar38 != uVar32);
            }
          }
        }
        uVar32 = local_170 + 1;
        piVar29 = (pointer)((long)local_e0 + (long)local_160);
        pvVar37 = (void *)((long)pvVar37 + __n * 4);
        piVar26 = (pointer)((long)local_168 + (long)local_160);
      } while (uVar32 != local_e8);
    }
  }
  else {
    uVar34 = iVar41 / iVar19;
    local_14c = this->num_output / iVar19;
    iVar41 = this->group;
    if (0 < (long)iVar41) {
      local_e8 = local_1b8.elemsize;
      local_140 = (pointer)(local_1b8.cstep * local_1b8.elemsize);
      _remain_1 = (float *)(ulong)(uint)(local_1b8.h * local_1b8.w);
      pvVar37 = (this->weight_data).data;
      iVar19 = this->bias_term;
      uVar35 = iVar31 * iVar33;
      uVar18 = (ulong)uVar35;
      lVar36 = (long)(int)local_14c;
      uVar38 = (ulong)local_14c;
      uVar32 = (ulong)(local_1b8.h * local_1b8.w + 3U & 0xfffffffc);
      lVar17 = (long)_remain_1 + -1;
      auVar47._8_4_ = (int)lVar17;
      auVar47._0_8_ = lVar17;
      auVar47._12_4_ = (int)((ulong)lVar17 >> 0x20);
      lVar17 = (long)local_140 * lVar36;
      iVar31 = uVar34 * uVar39 * local_14c;
      auVar47 = auVar47 ^ _DAT_00163170;
      local_138 = (ulong)(this->activation_type - 1);
      local_a8 = (pointer)((long)local_1b8.data + 0xc);
      local_100 = 0;
      local_b0 = (pointer)local_1b8.data;
      local_108 = 0;
      auVar46 = _DAT_00163350;
      auVar49 = _DAT_00163360;
      auVar50 = _DAT_00163170;
      local_130 = uVar32;
      do {
        if (0 < (int)local_14c) {
          local_168 = (pointer)((long)pvVar37 + (long)(int)local_100 * 4);
          local_f8 = (void *)(local_108 * lVar36);
          pfVar5 = (float *)(this->activation_params).data;
          pvVar6 = (this->bias_data).data;
          iVar33 = (int)local_108;
          uVar27 = 0;
          piVar29 = local_b0;
          piVar26 = local_a8;
          do {
            if (iVar19 == 0) {
              iVar43 = 0;
            }
            else {
              iVar43 = *(int *)((long)pvVar6 + (uVar27 + (long)local_f8) * 4);
            }
            if (0 < remain_1) {
              uVar22 = 0;
              do {
                auVar45._8_4_ = (int)uVar22;
                auVar45._0_8_ = uVar22;
                auVar45._12_4_ = (int)(uVar22 >> 0x20);
                auVar48 = (auVar45 | auVar49) ^ auVar50;
                iVar21 = auVar47._4_4_;
                if ((bool)(~(iVar21 < auVar48._4_4_ ||
                            auVar47._0_4_ < auVar48._0_4_ && auVar48._4_4_ == iVar21) & 1)) {
                  piVar26[uVar22 - 3] = iVar43;
                }
                if (auVar48._12_4_ <= auVar47._12_4_ &&
                    (auVar48._8_4_ <= auVar47._8_4_ || auVar48._12_4_ != auVar47._12_4_)) {
                  piVar26[uVar22 - 2] = iVar43;
                }
                auVar45 = (auVar45 | auVar46) ^ auVar50;
                iVar20 = auVar45._4_4_;
                if (iVar20 <= iVar21 && (iVar20 != iVar21 || auVar45._0_4_ <= auVar47._0_4_)) {
                  piVar26[uVar22 - 1] = iVar43;
                  piVar26[uVar22] = iVar43;
                }
                uVar22 = uVar22 + 4;
              } while (uVar32 != uVar22);
            }
            if (0 < (int)local_110) {
              local_e0 = (pointer)((uVar27 + (long)local_f8) * (long)local_140 + (long)pvVar4);
              iVar21 = this->stride_h * iVar16;
              local_118 = CONCAT44(local_118._4_4_,iVar21);
              iVar43 = this->stride_w;
              local_170 = 0;
              do {
                if (0 < (int)local_158) {
                  iVar20 = local_160->w;
                  sVar7 = local_160->elemsize;
                  sVar8 = local_160->cstep;
                  pvVar9 = local_160->data;
                  lVar25 = 0;
                  do {
                    if (0 < (int)uVar34) {
                      lVar14 = lVar25 * iVar43 * 4 + (long)(iVar21 * (int)local_170) * local_e8;
                      uVar32 = 0;
                      piVar23 = local_168;
                      do {
                        if (0 < (int)uVar39) {
                          fVar42 = *(float *)((long)pvVar9 +
                                             (uVar32 + uVar34 * iVar33) * sVar8 * sVar7 +
                                             lVar25 * 4 + (long)iVar20 * local_170 * sVar7);
                          uVar22 = 0;
                          do {
                            lVar30 = (long)piVar15[uVar22];
                            *(float *)((long)local_e0 + lVar30 * 4 + lVar14) =
                                 (float)piVar23[uVar22] * fVar42 +
                                 *(float *)((long)local_e0 + lVar30 * 4 + lVar14);
                            uVar22 = uVar22 + 1;
                          } while (uVar39 != uVar22);
                        }
                        uVar32 = uVar32 + 1;
                        piVar23 = piVar23 + __n;
                      } while (uVar32 != uVar34);
                    }
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != local_158);
                }
                local_170 = local_170 + 1;
              } while (local_170 != local_110);
            }
            local_128 = piVar26;
            _remain = piVar29;
            local_f0 = uVar27;
            if ((uint)local_138 < 4) {
              switch((long)&switchD_0015a35a::switchdataD_00163a8c +
                     (long)(int)(&switchD_0015a35a::switchdataD_00163a8c)[local_138]) {
              case 0x15a35c:
                if (0 < (int)uVar35) {
                  uVar32 = 0;
                  do {
                    fVar42 = (float)piVar29[uVar32];
                    if (fVar42 <= 0.0) {
                      fVar42 = 0.0;
                    }
                    piVar29[uVar32] = (int)fVar42;
                    uVar32 = uVar32 + 1;
                  } while (uVar18 != uVar32);
                }
                break;
              case 0x15a386:
                if (0 < (int)uVar35) {
                  fVar42 = *pfVar5;
                  fVar1 = pfVar5[1];
                  uVar32 = 0;
                  do {
                    if ((float)piVar29[uVar32] <= fVar42 && fVar42 != (float)piVar29[uVar32]) {
                      piVar29[uVar32] = (int)fVar42;
                    }
                    if (fVar1 < (float)piVar29[uVar32]) {
                      piVar29[uVar32] = (int)fVar1;
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar18 != uVar32);
                }
                break;
              case 0x15a3c5:
                if (0 < (int)uVar35) {
                  uVar32 = 0;
                  do {
                    fVar42 = expf((float)(_remain[uVar32] ^ auVar50._0_4_));
                    auVar49 = _DAT_00163360;
                    auVar46 = _DAT_00163350;
                    auVar50 = _DAT_00163170;
                    _remain[uVar32] = (int)(1.0 / (fVar42 + 1.0));
                    uVar32 = uVar32 + 1;
                  } while (uVar18 != uVar32);
                }
                break;
              case 0x15a44c:
                if (0 < (int)uVar35) {
                  fVar42 = *pfVar5;
                  uVar32 = 0;
                  do {
                    uVar40 = -(uint)(0.0 < (float)piVar29[uVar32]);
                    piVar29[uVar32] =
                         (int)((float)(~uVar40 & (uint)fVar42 | uVar40 & 0x3f800000) *
                              (float)piVar29[uVar32]);
                    uVar32 = uVar32 + 1;
                  } while (uVar18 != uVar32);
                }
              }
            }
            uVar27 = local_f0 + 1;
            piVar26 = (pointer)((long)local_128 + (long)local_140);
            local_168 = local_168 + (int)(uVar34 * uVar39);
            piVar29 = (pointer)((long)_remain + (long)local_140);
            uVar32 = local_130;
          } while (uVar27 != uVar38);
        }
        local_108 = local_108 + 1;
        local_a8 = (pointer)((long)local_a8 + lVar17);
        local_100 = (ulong)(uint)((int)local_100 + iVar31);
        local_b0 = (pointer)((long)local_b0 + lVar17);
      } while (local_108 != iVar41);
    }
  }
  iVar41 = this->pad_w;
  iVar16 = this->pad_h;
  if (iVar16 < 1 && iVar41 < 1) {
    Mat::operator=(top_blob,&local_1b8);
LAB_0015a59e:
    iVar16 = 0;
  }
  else {
    copy_cut_border(&local_1b8,top_blob,iVar16,iVar16,iVar41,iVar41,opt->blob_allocator,
                    opt->num_threads);
    iVar16 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_0015a59e;
  }
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0015a5be:
  if (local_1b8.refcount != (int *)0x0) {
    LOCK();
    *local_1b8.refcount = *local_1b8.refcount + -1;
    UNLOCK();
    if (*local_1b8.refcount == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if ((pointer)local_1b8.data != (pointer)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar16;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }


            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = 1.f / (1.f + exp(-outptr[i]));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = 1.f / (1.f + exp(-outptr[i]));
                    }
                }
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}